

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PredictSensorsMeasurements.cpp
# Opt level: O2

bool iDynTree::predictSensorsMeasurementsFromRawBuffers
               (Model *model,Traversal *traversal,LinkVelArray *buf_linkVel,
               LinkAccArray *buf_linkProperAcc,LinkInternalWrenches *buf_internalWrenches,
               SensorsMeasurements *predictedMeasurement)

{
  Model *this;
  bool bVar1;
  int iVar2;
  SensorsList *pSVar3;
  size_t sVar4;
  SixAxisForceTorqueSensor *this_00;
  AccelerometerSensor *this_01;
  undefined4 extraout_var;
  SpatialAcc *pSVar5;
  Twist *pTVar6;
  GyroscopeSensor *this_02;
  undefined4 extraout_var_00;
  ThreeAxisAngularAccelerometerSensor *this_03;
  undefined4 extraout_var_01;
  size_t idx;
  size_t sVar7;
  size_t idx_1;
  Wrench predictedWrench;
  SensorType local_9c;
  size_t local_98;
  SensorsMeasurements *local_90;
  LinkInternalWrenches *local_88;
  LinkVelArray *local_80;
  LinkAccArray *local_78;
  Model *local_70;
  Vector3 local_68 [2];
  
  local_90 = predictedMeasurement;
  local_88 = buf_internalWrenches;
  local_80 = buf_linkVel;
  local_78 = buf_linkProperAcc;
  pSVar3 = Model::sensors(model);
  local_68[0].m_data[0]._0_4_ = 0;
  sVar4 = SensorsList::getNrOfSensors(pSVar3,(SensorType *)local_68);
  bVar1 = true;
  sVar7 = 0;
  while( true ) {
    pSVar3 = Model::sensors(model);
    if (sVar4 == sVar7) break;
    local_68[0].m_data[0]._0_4_ = 0;
    this_00 = (SixAxisForceTorqueSensor *)
              SensorsList::getSensor(pSVar3,(SensorType *)local_68,sVar7);
    SixAxisForceTorqueSensor::predictMeasurement((Wrench *)local_68,this_00,traversal,local_88);
    if (bVar1 == false) {
      bVar1 = false;
    }
    else {
      local_9c = SIX_AXIS_FORCE_TORQUE;
      local_98 = sVar7;
      bVar1 = SensorsMeasurements::setMeasurement
                        (local_90,&local_9c,(ptrdiff_t *)&local_98,(Wrench *)local_68);
    }
    iDynTree::SpatialForceVector::~SpatialForceVector((SpatialForceVector *)local_68);
    sVar7 = sVar7 + 1;
  }
  local_68[0].m_data[0]._0_4_ = 1;
  sVar4 = SensorsList::getNrOfSensors(pSVar3,(SensorType *)local_68);
  local_88 = (LinkInternalWrenches *)(sVar4 & 0xffffffff);
  sVar4 = 0;
  local_70 = model;
  while( true ) {
    this = local_70;
    pSVar3 = Model::sensors(local_70);
    if (local_88 == (LinkInternalWrenches *)sVar4) break;
    local_68[0].m_data[0]._0_4_ = 1;
    this_01 = (AccelerometerSensor *)SensorsList::getSensor(pSVar3,(SensorType *)local_68,sVar4);
    iVar2 = (*(this_01->super_LinkSensor).super_Sensor._vptr_Sensor[10])(this_01);
    pSVar5 = LinkAccArray::operator()(local_78,CONCAT44(extraout_var,iVar2));
    pTVar6 = LinkVelArray::operator()(local_80,CONCAT44(extraout_var,iVar2));
    AccelerometerSensor::predictMeasurement((LinAcceleration *)local_68,this_01,pSVar5,pTVar6);
    if (bVar1 == false) {
      bVar1 = false;
    }
    else {
      local_9c = ACCELEROMETER;
      local_98 = sVar4;
      bVar1 = SensorsMeasurements::setMeasurement
                        (local_90,&local_9c,(ptrdiff_t *)&local_98,local_68);
    }
    sVar4 = sVar4 + 1;
  }
  local_68[0].m_data[0]._0_4_ = 2;
  sVar4 = SensorsList::getNrOfSensors(pSVar3,(SensorType *)local_68);
  sVar7 = 0;
  while( true ) {
    pSVar3 = Model::sensors(this);
    if ((sVar4 & 0xffffffff) == sVar7) break;
    local_68[0].m_data[0]._0_4_ = 2;
    this_02 = (GyroscopeSensor *)SensorsList::getSensor(pSVar3,(SensorType *)local_68,sVar7);
    iVar2 = (*(this_02->super_LinkSensor).super_Sensor._vptr_Sensor[10])(this_02);
    pTVar6 = LinkVelArray::operator()(local_80,CONCAT44(extraout_var_00,iVar2));
    GyroscopeSensor::predictMeasurement((AngVelocity *)local_68,this_02,pTVar6);
    if (bVar1 == false) {
      bVar1 = false;
    }
    else {
      local_9c = GYROSCOPE;
      local_98 = sVar7;
      bVar1 = SensorsMeasurements::setMeasurement
                        (local_90,&local_9c,(ptrdiff_t *)&local_98,local_68);
    }
    sVar7 = sVar7 + 1;
  }
  local_68[0].m_data[0]._0_4_ = 3;
  sVar4 = SensorsList::getNrOfSensors(pSVar3,(SensorType *)local_68);
  for (sVar7 = 0; (sVar4 & 0xffffffff) != sVar7; sVar7 = sVar7 + 1) {
    pSVar3 = Model::sensors(this);
    local_68[0].m_data[0]._0_4_ = 3;
    this_03 = (ThreeAxisAngularAccelerometerSensor *)
              SensorsList::getSensor(pSVar3,(SensorType *)local_68,sVar7);
    iVar2 = (*(this_03->super_LinkSensor).super_Sensor._vptr_Sensor[10])(this_03);
    pSVar5 = LinkAccArray::operator()(local_78,CONCAT44(extraout_var_01,iVar2));
    ThreeAxisAngularAccelerometerSensor::predictMeasurement(local_68,this_03,pSVar5);
    if (bVar1 == false) {
      bVar1 = false;
    }
    else {
      local_9c = THREE_AXIS_ANGULAR_ACCELEROMETER;
      local_98 = sVar7;
      bVar1 = SensorsMeasurements::setMeasurement
                        (local_90,&local_9c,(ptrdiff_t *)&local_98,local_68);
    }
  }
  return bVar1;
}

Assistant:

bool predictSensorsMeasurementsFromRawBuffers(const Model& model,
                                              const Traversal& traversal,
                                              const LinkVelArray& buf_linkVel,
                                              const LinkAccArray& buf_linkProperAcc,
                                              const LinkInternalWrenches& buf_internalWrenches,
                                              SensorsMeasurements& predictedMeasurement)
{
    bool retVal = true;

    size_t numOfFTs = model.sensors().getNrOfSensors(iDynTree::SIX_AXIS_FORCE_TORQUE);
    for(size_t idx = 0; idx<numOfFTs; idx++)
    {
        SixAxisForceTorqueSensor * ftSens = (SixAxisForceTorqueSensor*)model.sensors().getSensor(iDynTree::SIX_AXIS_FORCE_TORQUE, idx);

        Wrench predictedWrench = ftSens->predictMeasurement(traversal,buf_internalWrenches);
        retVal = retVal && predictedMeasurement.setMeasurement(iDynTree::SIX_AXIS_FORCE_TORQUE,idx,predictedWrench);
    }


    //Iterate through each accelrometer and find its parent. Compute local (classical accelration)
    // It is automatically proper acceleration since gravity is incorporated into the base acceleration
    unsigned int numAccl = model.sensors().getNrOfSensors(iDynTree::ACCELEROMETER);
    for(size_t idx = 0; idx<numAccl; idx++)
    {
        AccelerometerSensor * accelerometer = (AccelerometerSensor *)model.sensors().getSensor(iDynTree::ACCELEROMETER, idx);
        LinkIndex parentLinkId = accelerometer->getParentLinkIndex();
        LinAcceleration predictedAcc = accelerometer->predictMeasurement(buf_linkProperAcc(parentLinkId),
                                                                         buf_linkVel(parentLinkId));
        retVal = retVal && predictedMeasurement.setMeasurement(iDynTree::ACCELEROMETER,idx,predictedAcc);
    }

    unsigned int numGyro = model.sensors().getNrOfSensors(iDynTree::GYROSCOPE);
    for(size_t idx = 0; idx<numGyro; idx++)
    {
        GyroscopeSensor * gyroscope = (GyroscopeSensor*)model.sensors().getSensor(iDynTree::GYROSCOPE, idx);
        LinkIndex parentLinkId = gyroscope->getParentLinkIndex();
        AngVelocity predictedAngVel = gyroscope->predictMeasurement(buf_linkVel(parentLinkId));
        retVal = retVal && predictedMeasurement.setMeasurement(iDynTree::GYROSCOPE,idx,predictedAngVel);
    }

    unsigned int numAngAccl = model.sensors().getNrOfSensors(iDynTree::THREE_AXIS_ANGULAR_ACCELEROMETER);
    for(size_t idx = 0; idx<numAngAccl; idx++)
    {
        ThreeAxisAngularAccelerometerSensor * angAccelerometer =
        (ThreeAxisAngularAccelerometerSensor*)model.sensors().getSensor(iDynTree::THREE_AXIS_ANGULAR_ACCELEROMETER, idx);
        LinkIndex parentLinkId = angAccelerometer->getParentLinkIndex();
        Vector3 predictedAngAcc = angAccelerometer->predictMeasurement(buf_linkProperAcc(parentLinkId));
        retVal = retVal && predictedMeasurement.setMeasurement(iDynTree::THREE_AXIS_ANGULAR_ACCELEROMETER,idx,predictedAngAcc);
    }

    return retVal;
}